

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv4Transmitter::RTPUDPv4Transmitter(RTPUDPv4Transmitter *this,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  RTPUDPv4Transmitter *this_local;
  
  RTPTransmitter::RTPTransmitter(&this->super_RTPTransmitter,mgr);
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv4Transmitter_001adfe8;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&this->localIPs);
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
  ::RTPHashTable(&this->destinations,mgr,0xd);
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::RTPHashTable
            (&this->multicastgroups,mgr,0xe);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::list
            (&this->rawpacketlist);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::RTPKeyHashTable(&this->acceptignoreinfo,mgr,0xb);
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->created = false;
  this->init = false;
  return;
}

Assistant:

RTPUDPv4Transmitter::RTPUDPv4Transmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr),destinations(mgr,RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),
#ifdef RTP_SUPPORT_IPV4MULTICAST
								  multicastgroups(mgr,RTPMEM_TYPE_CLASS_MULTICASTHASHELEMENT),
#endif // RTP_SUPPORT_IPV4MULTICAST
								  acceptignoreinfo(mgr,RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}